

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O1

size_t __thiscall BamTools::Internal::BgzfStream::DeflateBlock(BgzfStream *this,int32_t blockLength)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  BamException *pBVar6;
  int iVar7;
  ulong uVar8;
  size_t sVar9;
  uint uVar10;
  string local_f8;
  string local_d8;
  int32_t local_b4;
  char *local_b0;
  char *local_a8;
  string local_a0;
  undefined4 local_80;
  long local_78;
  undefined8 local_60;
  undefined8 uStack_58;
  
  uVar8 = (ulong)(uint)blockLength;
  local_b0 = (this->m_compressedBlock).Buffer;
  local_b0[0] = '\0';
  local_b0[1] = '\0';
  local_b0[2] = '\0';
  local_b0[3] = '\0';
  local_b0[4] = '\0';
  local_b0[5] = '\0';
  local_b0[6] = '\0';
  local_b0[7] = '\0';
  local_b0[8] = '\0';
  local_b0[9] = '\0';
  local_b0[10] = '\0';
  local_b0[0xb] = '\0';
  local_b0[0xc] = '\0';
  local_b0[0xd] = '\0';
  local_b0[0xe] = '\0';
  local_b0[0xf] = '\0';
  local_b0[0x10] = '\0';
  local_b0[0x11] = '\0';
  local_b0[0] = '\x1f';
  local_b0[1] = -0x75;
  local_b0[2] = '\b';
  local_b0[3] = '\x04';
  local_b0[9] = -1;
  local_b0[10] = '\x06';
  local_b0[0xc] = 'B';
  local_b0[0xd] = 'C';
  local_b0[0xe] = '\x02';
  bVar1 = this->m_isWriteCompressed;
  local_a8 = local_b0 + 0x12;
  sVar9 = 0;
  local_b4 = blockLength;
  do {
    local_60 = 0;
    uStack_58 = 0;
    local_a0._M_dataplus._M_p = (this->m_uncompressedBlock).Buffer;
    iVar7 = (int)uVar8;
    local_a0.field_2._8_8_ = local_a8;
    local_80 = 0xffe6;
    local_a0._M_string_length._0_4_ = iVar7;
    iVar3 = deflateInit2_(&local_a0,-(uint)bVar1,8,0xfffffff1,8,0,"1.2.11",0x70);
    if (iVar3 != 0) {
      pBVar6 = (BamException *)__cxa_allocate_exception(0x28);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"BgzfStream::DeflateBlock","");
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"zlib deflateInit2 failed","");
      BamException::BamException(pBVar6,&local_f8,&local_d8);
      __cxa_throw(pBVar6,&BamException::typeinfo,BamException::~BamException);
    }
    iVar3 = deflate(&local_a0,4);
    iVar4 = deflateEnd(&local_a0);
    pcVar2 = local_b0;
    if (iVar3 == 1) {
      if (iVar4 != 0) {
        pBVar6 = (BamException *)__cxa_allocate_exception(0x28);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8,"BgzfStream::DeflateBlock","");
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"zlib deflateEnd failed","");
        BamException::BamException(pBVar6,&local_f8,&local_d8);
        __cxa_throw(pBVar6,&BamException::typeinfo,BamException::~BamException);
      }
      sVar9 = local_78 + 0x1a;
      if (0x10000 < sVar9) {
        pBVar6 = (BamException *)__cxa_allocate_exception(0x28);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8,"BgzfStream::DeflateBlock","");
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"deflate overflow","");
        BamException::BamException(pBVar6,&local_f8,&local_d8);
        __cxa_throw(pBVar6,&BamException::typeinfo,BamException::~BamException);
      }
    }
    else {
      if (iVar3 != 0) {
        pBVar6 = (BamException *)__cxa_allocate_exception(0x28);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8,"BgzfStream::DeflateBlock","");
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"zlib deflate failed","");
        BamException::BamException(pBVar6,&local_f8,&local_d8);
        __cxa_throw(pBVar6,&BamException::typeinfo,BamException::~BamException);
      }
      if (iVar7 < 0x400) {
        pBVar6 = (BamException *)__cxa_allocate_exception(0x28);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8,"BgzfStream::DeflateBlock","");
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"input reduction failed","");
        BamException::BamException(pBVar6,&local_f8,&local_d8);
        __cxa_throw(pBVar6,&BamException::typeinfo,BamException::~BamException);
      }
      uVar8 = (ulong)(iVar7 - 0x400);
    }
    if (iVar3 == 1) {
      *(short *)(local_b0 + 0x10) = (short)sVar9 + -1;
      uVar5 = crc32(0,0,0);
      iVar3 = (int)uVar8;
      uVar5 = crc32(uVar5,(this->m_uncompressedBlock).Buffer,uVar8);
      pcVar2[sVar9 - 8] = (char)uVar5;
      pcVar2[sVar9 - 7] = (char)((uint)uVar5 >> 8);
      pcVar2[sVar9 - 6] = (char)((uint)uVar5 >> 0x10);
      pcVar2[sVar9 - 5] = (char)((uint)uVar5 >> 0x18);
      pcVar2[sVar9 - 4] = (char)uVar8;
      pcVar2[sVar9 - 3] = (char)(uVar8 >> 8);
      pcVar2[sVar9 - 2] = (char)(uVar8 >> 0x10);
      pcVar2[sVar9 - 1] = (char)(uVar8 >> 0x18);
      uVar10 = local_b4 - iVar3;
      if (uVar10 != 0 && iVar3 <= local_b4) {
        if (iVar3 < (int)uVar10) {
          pBVar6 = (BamException *)__cxa_allocate_exception(0x28);
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,"BgzfStream::DeflateBlock","");
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f8,"after deflate, remainder too large","");
          BamException::BamException(pBVar6,&local_a0,&local_f8);
          __cxa_throw(pBVar6,&BamException::typeinfo,BamException::~BamException);
        }
        pcVar2 = (this->m_uncompressedBlock).Buffer;
        memcpy(pcVar2,pcVar2 + uVar8,(ulong)uVar10);
      }
      this->m_blockOffset = uVar10;
      return sVar9;
    }
  } while( true );
}

Assistant:

std::size_t BgzfStream::DeflateBlock(int32_t blockLength)
{

    // initialize the gzip header
    char* buffer = m_compressedBlock.Buffer;
    memset(buffer, 0, 18);
    buffer[0] = Constants::GZIP_ID1;
    buffer[1] = Constants::GZIP_ID2;
    buffer[2] = Constants::CM_DEFLATE;
    buffer[3] = Constants::FLG_FEXTRA;
    buffer[9] = Constants::OS_UNKNOWN;
    buffer[10] = Constants::BGZF_XLEN;
    buffer[12] = Constants::BGZF_ID1;
    buffer[13] = Constants::BGZF_ID2;
    buffer[14] = Constants::BGZF_LEN;

    // set compression level
    const int compressionLevel = (m_isWriteCompressed ? Z_DEFAULT_COMPRESSION : 0);

    // loop to retry for blocks that do not compress enough
    int inputLength = blockLength;
    std::size_t compressedLength = 0;
    const unsigned int bufferSize = Constants::BGZF_MAX_BLOCK_SIZE;

    while (true) {

        // initialize zstream values
        z_stream zs;
        zs.zalloc = NULL;
        zs.zfree = NULL;
        zs.next_in = (Bytef*)m_uncompressedBlock.Buffer;
        zs.avail_in = inputLength;
        zs.next_out = (Bytef*)&buffer[Constants::BGZF_BLOCK_HEADER_LENGTH];
        zs.avail_out =
            bufferSize - Constants::BGZF_BLOCK_HEADER_LENGTH - Constants::BGZF_BLOCK_FOOTER_LENGTH;

        // initialize the zlib compression algorithm
        int status = deflateInit2(&zs, compressionLevel, Z_DEFLATED, Constants::GZIP_WINDOW_BITS,
                                  Constants::Z_DEFAULT_MEM_LEVEL, Z_DEFAULT_STRATEGY);
        if (status != Z_OK)
            throw BamException("BgzfStream::DeflateBlock", "zlib deflateInit2 failed");

        // compress the data
        status = deflate(&zs, Z_FINISH);

        // if not at stream end
        if (status != Z_STREAM_END) {

            deflateEnd(&zs);

            // there was not enough space available in buffer
            // try to reduce the input length & re-start loop
            if (status == Z_OK) {
                inputLength -= 1024;
                if (inputLength < 0)
                    throw BamException("BgzfStream::DeflateBlock", "input reduction failed");
                continue;
            }

            throw BamException("BgzfStream::DeflateBlock", "zlib deflate failed");
        }

        // finalize the compression routine
        status = deflateEnd(&zs);
        if (status != Z_OK)
            throw BamException("BgzfStream::DeflateBlock", "zlib deflateEnd failed");

        // update compressedLength
        compressedLength = zs.total_out + Constants::BGZF_BLOCK_HEADER_LENGTH +
                           Constants::BGZF_BLOCK_FOOTER_LENGTH;
        if (compressedLength > Constants::BGZF_MAX_BLOCK_SIZE)
            throw BamException("BgzfStream::DeflateBlock", "deflate overflow");

        // quit while loop
        break;
    }

    // store the compressed length
    BamTools::PackUnsignedShort(&buffer[16], static_cast<uint16_t>(compressedLength - 1));

    // store the CRC32 checksum
    uint32_t crc = crc32(0, NULL, 0);
    crc = crc32(crc, (Bytef*)m_uncompressedBlock.Buffer, inputLength);
    BamTools::PackUnsignedInt(&buffer[compressedLength - 8], crc);
    BamTools::PackUnsignedInt(&buffer[compressedLength - 4], inputLength);

    // ensure that we have less than a block of data left
    int remaining = blockLength - inputLength;
    if (remaining > 0) {
        if (remaining > inputLength)
            throw BamException("BgzfStream::DeflateBlock", "after deflate, remainder too large");
        memcpy(m_uncompressedBlock.Buffer, m_uncompressedBlock.Buffer + inputLength, remaining);
    }

    // update block data
    m_blockOffset = remaining;

    // return result
    return compressedLength;
}